

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void fix_superclasses(gvisitor_t *self)

{
  void *pvVar1;
  ulong *puVar2;
  long local_58;
  gnode_class_decl_t *local_50;
  gravity_class_t *c;
  gnode_class_decl_t *super;
  gnode_class_decl_t *node;
  size_t i;
  size_t count;
  gnode_class_r *superfix;
  codegen_t *data;
  gvisitor_t *self_local;
  
  pvVar1 = self->data;
  puVar2 = (ulong *)((long)pvVar1 + 0x18);
  if (puVar2 == (ulong *)0x0) {
    local_50 = (gnode_class_decl_t *)0x0;
  }
  else {
    local_50 = (gnode_class_decl_t *)*puVar2;
  }
  for (node = (gnode_class_decl_t *)0x0; node < local_50;
      node = (gnode_class_decl_t *)((long)&(node->base).tag + 1)) {
    if (node < (gnode_class_decl_t *)*puVar2) {
      local_58 = *(long *)(*(long *)((long)pvVar1 + 0x28) + (long)node * 8);
    }
    else {
      local_58 = 0;
    }
    gravity_class_setsuper
              (*(gravity_class_t **)(local_58 + 0x90),
               *(gravity_class_t **)(*(long *)(local_58 + 0x68) + 0x90));
  }
  return;
}

Assistant:

static void fix_superclasses (gvisitor_t *self) {
    // this function cannot fail because superclasses was already checked in samecheck2 so I am sure that they exist somewhere
    codegen_t        *data = (codegen_t *)self->data;
    gnode_class_r    *superfix = &data->superfix;

    size_t count = gnode_array_size(superfix);
    for (size_t i=0; i<count; ++i) {
        gnode_class_decl_t *node = (gnode_class_decl_t *)gnode_array_get(superfix, i);
        gnode_class_decl_t *super = (gnode_class_decl_t *)node->superclass;

        gravity_class_t *c = (gravity_class_t *)node->data;
        gravity_class_setsuper(c, (gravity_class_t *)super->data);
    }
}